

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

real __thiscall fasttext::DenseMatrix::dotRow(DenseMatrix *this,Vector *vec,int64_t i)

{
  undefined1 auVar1 [16];
  uint __line;
  long lVar2;
  real *prVar3;
  EncounteredNaNError *this_00;
  char *__assertion;
  int64_t j;
  long j_00;
  real rVar4;
  undefined1 auVar5 [64];
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x68;
  }
  else if (i < (this->super_Matrix).m_) {
    lVar2 = (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    if (lVar2 == (this->super_Matrix).n_) {
      auVar5 = ZEXT1664(ZEXT816(0) << 0x40);
      for (j_00 = 0; rVar4 = auVar5._0_4_, j_00 < lVar2; j_00 = j_00 + 1) {
        prVar3 = at(this,i,j_00);
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)rVar4),ZEXT416((uint)*prVar3),
                                 ZEXT416((uint)(vec->data_).
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_start[j_00]));
        auVar5 = ZEXT464(auVar1._0_4_);
        lVar2 = (this->super_Matrix).n_;
      }
      if (!NAN(rVar4)) {
        return rVar4;
      }
      this_00 = (EncounteredNaNError *)__cxa_allocate_exception(0x10);
      EncounteredNaNError::EncounteredNaNError(this_00);
      __cxa_throw(this_00,&EncounteredNaNError::typeinfo,std::runtime_error::~runtime_error);
    }
    __assertion = "vec.size() == n_";
    __line = 0x6a;
  }
  else {
    __assertion = "i < m_";
    __line = 0x69;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/densematrix.cc"
                ,__line,"virtual real fasttext::DenseMatrix::dotRow(const Vector &, int64_t) const")
  ;
}

Assistant:

real DenseMatrix::dotRow(const Vector& vec, int64_t i) const {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  real d = 0.0;
  for (int64_t j = 0; j < n_; j++) {
    d += at(i, j) * vec[j];
  }
  if (std::isnan(d)) {
    throw EncounteredNaNError();
  }
  return d;
}